

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsfe_Emu.cpp
# Opt level: O1

blargg_err_t
read_strs(Data_Reader *in,long size,blargg_vector<char> *chars,blargg_vector<const_char_*> *strs)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_var;
  char **ppcVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  size_t __size;
  char *local_48;
  
  __size = size + 1;
  pcVar3 = (char *)realloc(chars->begin_,__size);
  if (pcVar3 == (char *)0x0 && __size != 0) {
    local_48 = "Out of memory";
  }
  else {
    chars->begin_ = pcVar3;
    chars->size_ = __size;
    chars->begin_[size] = '\0';
    iVar2 = (*in->_vptr_Data_Reader[3])(in,chars->begin_,size);
    local_48 = (char *)CONCAT44(extraout_var,iVar2);
    if (local_48 == (blargg_err_t)0x0) {
      ppcVar4 = (char **)realloc(strs->begin_,0x400);
      if (ppcVar4 == (char **)0x0) {
        local_48 = "Out of memory";
      }
      else {
        strs->begin_ = ppcVar4;
        strs->size_ = 0x80;
        bVar1 = 0 < size;
        local_48 = (blargg_err_t)0x0;
        if (size < 1) {
          uVar6 = 0;
        }
        else {
          lVar7 = 0;
          lVar5 = 0;
          iVar2 = 0;
          uVar6 = 0;
          do {
            if ((int)strs->size_ <= lVar7) {
              ppcVar4 = (char **)realloc(strs->begin_,lVar7 << 4);
              if (lVar7 != 0 && ppcVar4 == (char **)0x0) {
                uVar6 = (uint)lVar7;
                local_48 = "Out of memory";
                break;
              }
              strs->begin_ = ppcVar4;
              strs->size_ = lVar7 * 2;
            }
            strs->begin_[lVar7] = chars->begin_ + lVar5;
            lVar5 = (long)iVar2;
            if (lVar5 < size) {
              do {
                if (chars->begin_[lVar5] == '\0') break;
                lVar5 = lVar5 + 1;
              } while (lVar5 < size);
              iVar2 = (int)lVar5;
            }
            lVar7 = lVar7 + 1;
            uVar6 = uVar6 + 1;
            iVar2 = iVar2 + 1;
            lVar5 = (long)iVar2;
            bVar1 = lVar5 < size;
          } while (lVar5 < size);
        }
        if (!bVar1) {
          ppcVar4 = (char **)realloc(strs->begin_,(ulong)uVar6 * 8);
          if (uVar6 == 0 || ppcVar4 != (char **)0x0) {
            strs->begin_ = ppcVar4;
            strs->size_ = (ulong)uVar6;
            local_48 = (blargg_err_t)0x0;
          }
          else {
            local_48 = "Out of memory";
          }
        }
      }
    }
  }
  return local_48;
}

Assistant:

static blargg_err_t read_strs( Data_Reader& in, long size, blargg_vector<char>& chars,
		blargg_vector<const char*>& strs )
{
	RETURN_ERR( chars.resize( size + 1 ) );
	chars [size] = 0; // in case last string doesn't have terminator
	RETURN_ERR( in.read( &chars [0], size ) );
	
	RETURN_ERR( strs.resize( 128 ) );
	int count = 0;
	for ( int i = 0; i < size; i++ )
	{
		if ( (int) strs.size() <= count )
			RETURN_ERR( strs.resize( count * 2 ) );
		strs [count++] = &chars [i];
		while ( i < size && chars [i] )
			i++;
	}
	
	return strs.resize( count );
}